

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O1

void __thiscall
PDA::Transducer::Grammar::Rule::addChains<wchar_t[4],wchar_t[5],wchar_t[7],wchar_t[7]>
          (Rule *this,wchar_t (*first) [4],wchar_t (*rest) [5],wchar_t (*rest_1) [7],
          wchar_t (*rest_2) [7])

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  size_t sVar2;
  long *local_70;
  long local_68;
  long local_60 [2];
  Chain local_50;
  
  local_70 = local_60;
  sVar2 = wcslen(*first);
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_70,first,*first + sVar2);
  paVar1 = &local_50.m_chain.field_2;
  local_50.m_chain._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_50,local_70,(long)local_70 + local_68 * 4);
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  emplace_back<PDA::Transducer::Grammar::Chain>(&this->m_chains,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50.m_chain._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.m_chain._M_dataplus._M_p,
                    local_50.m_chain.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] * 4 + 4);
  }
  addChains<wchar_t[5],wchar_t[7],wchar_t[7]>(this,rest,rest_1,rest_2);
  return;
}

Assistant:

void addChains(const First &first, const Rest&... rest)
        {
            m_chains.push_back(Chain(first));
            addChains(rest...);
        }